

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_acs.cpp
# Opt level: O2

void __thiscall ACSStringPool::WriteStrings(ACSStringPool *this,FILE *file,DWORD id)

{
  PoolEntry *pPVar1;
  long lVar2;
  long lVar3;
  int32_t poolsize;
  FPNGChunkArchive arc;
  
  poolsize = (this->Pool).Count;
  if (poolsize != 0) {
    FPNGChunkArchive::FPNGChunkArchive(&arc,file,id);
    FArchive::operator<<(&arc.super_FArchive,(DWORD *)&poolsize);
    lVar2 = 0;
    for (lVar3 = 0; lVar3 < poolsize; lVar3 = lVar3 + 1) {
      pPVar1 = (this->Pool).Array;
      if (*(int *)((long)&pPVar1->Next + lVar2) != -2) {
        FArchive::WriteCount(&arc.super_FArchive,(DWORD)lVar3);
        FArchive::WriteString(&arc.super_FArchive,(FString *)((long)&(pPVar1->Str).Chars + lVar2));
        FArchive::WriteCount(&arc.super_FArchive,*(DWORD *)((long)&pPVar1->LockCount + lVar2));
      }
      lVar2 = lVar2 + 0x18;
    }
    FArchive::WriteCount(&arc.super_FArchive,0xffffffff);
    FPNGChunkArchive::~FPNGChunkArchive(&arc);
  }
  return;
}

Assistant:

int ACSStringPool::AddString(FString &str)
{
	unsigned int h = SuperFastHash(str.GetChars(), str.Len());
	unsigned int bucketnum = h % NUM_BUCKETS;
	int i = FindString(str, str.Len(), h, bucketnum);
	if (i >= 0)
	{
		return i | STRPOOL_LIBRARYID_OR;
	}
	return InsertString(str, h, bucketnum);
}